

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_integerwidth.cpp
# Opt level: O3

void __thiscall
icu_63::number::IntegerWidth::apply(IntegerWidth *this,DecimalQuantity *quantity,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  
  if (this->fHasError == true) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  iVar3 = (int)(this->fUnion).minMaxInt.fMaxInt;
  if (iVar3 == -1) {
    sVar1 = (this->fUnion).minMaxInt.fMinInt;
    iVar2 = 0x7fffffff;
  }
  else {
    if ((this->fUnion).minMaxInt.fFormatFailIfMoreThanMaxDigits == true) {
      iVar2 = impl::DecimalQuantity::getMagnitude(quantity);
      if (iVar3 < iVar2) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
    sVar1 = (this->fUnion).minMaxInt.fMinInt;
    iVar2 = (int32_t)(this->fUnion).minMaxInt.fMaxInt;
  }
  impl::DecimalQuantity::setIntegerLength(quantity,(int)sVar1,iVar2);
  return;
}

Assistant:

void IntegerWidth::apply(impl::DecimalQuantity& quantity, UErrorCode& status) const {
    if (fHasError) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    } else if (fUnion.minMaxInt.fMaxInt == -1) {
        quantity.setIntegerLength(fUnion.minMaxInt.fMinInt, INT32_MAX);
    } else {
        // Enforce the backwards-compatibility feature "FormatFailIfMoreThanMaxDigits"
        if (fUnion.minMaxInt.fFormatFailIfMoreThanMaxDigits &&
            fUnion.minMaxInt.fMaxInt < quantity.getMagnitude()) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        quantity.setIntegerLength(fUnion.minMaxInt.fMinInt, fUnion.minMaxInt.fMaxInt);
    }
}